

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O0

bool cmsys::SystemTools::CopyFileAlways(string *source,string *destination)

{
  bool bVar1;
  byte bVar2;
  _Ios_Openmode _Var3;
  char *pcVar4;
  long lVar5;
  long local_14e8;
  ofstream fout;
  long local_12e0;
  ifstream fin;
  string local_10d8;
  string local_10b8;
  undefined1 local_1098 [8];
  string source_name;
  string destination_dir;
  char buffer [4096];
  int bufferSize;
  undefined1 local_48 [8];
  string real_destination;
  bool perms;
  mode_t perm;
  string *destination_local;
  string *source_local;
  
  bVar1 = SameFile(source,destination);
  if (bVar1) {
    source_local._7_1_ = 1;
    goto LAB_007b0edd;
  }
  real_destination.field_2._12_4_ = 0;
  real_destination.field_2._M_local_buf[0xb] =
       GetPermissions(source,(mode_t *)(real_destination.field_2._M_local_buf + 0xc));
  std::__cxx11::string::string((string *)local_48,(string *)destination);
  bVar1 = FileIsDirectory(source);
  if (bVar1) {
    MakeDirectory(destination);
LAB_007b0e7f:
    if (((real_destination.field_2._M_local_buf[0xb] & 1U) == 0) ||
       (bVar1 = SetPermissions((string *)local_48,real_destination.field_2._12_4_,false), bVar1)) {
      source_local._7_1_ = 1;
      fout._508_4_ = 1;
    }
    else {
      source_local._7_1_ = 0;
      fout._508_4_ = 1;
    }
  }
  else {
    std::__cxx11::string::string((string *)(source_name.field_2._M_local_buf + 8));
    bVar1 = FileIsDirectory(destination);
    if (bVar1) {
      std::__cxx11::string::operator=
                ((string *)(source_name.field_2._M_local_buf + 8),(string *)local_48);
      ConvertToUnixSlashes((string *)local_48);
      std::__cxx11::string::operator+=((string *)local_48,'/');
      std::__cxx11::string::string((string *)local_1098,(string *)source);
      GetFilenameName(&local_10b8,(string *)local_1098);
      std::__cxx11::string::operator+=((string *)local_48,(string *)&local_10b8);
      std::__cxx11::string::~string((string *)&local_10b8);
      std::__cxx11::string::~string((string *)local_1098);
    }
    else {
      GetFilenamePath(&local_10d8,destination);
      std::__cxx11::string::operator=
                ((string *)(source_name.field_2._M_local_buf + 8),(string *)&local_10d8);
      std::__cxx11::string::~string((string *)&local_10d8);
    }
    MakeDirectory((string *)((long)&source_name.field_2 + 8));
    pcVar4 = (char *)std::__cxx11::string::c_str();
    _Var3 = std::operator|(_S_in,_S_bin);
    std::ifstream::ifstream(&local_12e0,pcVar4,_Var3);
    bVar2 = std::ios::operator!((ios *)((long)&local_12e0 + *(long *)(local_12e0 + -0x18)));
    if ((bVar2 & 1) == 0) {
      RemoveFile((string *)local_48);
      pcVar4 = (char *)std::__cxx11::string::c_str();
      _Var3 = std::operator|(_S_out,_S_trunc);
      _Var3 = std::operator|(_Var3,_S_bin);
      std::ofstream::ofstream(&local_14e8,pcVar4,_Var3);
      bVar2 = std::ios::operator!((ios *)((long)&local_14e8 + *(long *)(local_14e8 + -0x18)));
      if ((bVar2 & 1) == 0) {
        while (bVar1 = std::ios::operator_cast_to_bool
                                 ((ios *)((long)&local_12e0 + *(long *)(local_12e0 + -0x18))), bVar1
              ) {
          std::istream::read((char *)&local_12e0,(long)((long)&destination_dir.field_2 + 8));
          lVar5 = std::istream::gcount();
          if (lVar5 == 0) break;
          std::istream::gcount();
          std::ostream::write((char *)&local_14e8,(long)((long)&destination_dir.field_2 + 8));
        }
        std::ostream::flush();
        std::ifstream::close();
        std::ofstream::close();
        bVar2 = std::ios::operator!((ios *)((long)&local_14e8 + *(long *)(local_14e8 + -0x18)));
        if ((bVar2 & 1) == 0) {
          fout._508_4_ = 0;
        }
        else {
          source_local._7_1_ = 0;
          fout._508_4_ = 1;
        }
      }
      else {
        source_local._7_1_ = 0;
        fout._508_4_ = 1;
      }
      std::ofstream::~ofstream(&local_14e8);
    }
    else {
      source_local._7_1_ = 0;
      fout._508_4_ = 1;
    }
    std::ifstream::~ifstream(&local_12e0);
    std::__cxx11::string::~string((string *)(source_name.field_2._M_local_buf + 8));
    if (fout._508_4_ == 0) goto LAB_007b0e7f;
  }
  std::__cxx11::string::~string((string *)local_48);
LAB_007b0edd:
  return (bool)(source_local._7_1_ & 1);
}

Assistant:

bool SystemTools::CopyFileAlways(const std::string& source, const std::string& destination)
{
  // If files are the same do not copy
  if ( SystemTools::SameFile(source, destination) )
    {
    return true;
    }
  mode_t perm = 0;
  bool perms = SystemTools::GetPermissions(source, perm);
  std::string real_destination = destination;

  if(SystemTools::FileIsDirectory(source))
    {
    SystemTools::MakeDirectory(destination);
    }
  else
    {
    const int bufferSize = 4096;
    char buffer[bufferSize];

    // If destination is a directory, try to create a file with the same
    // name as the source in that directory.

    std::string destination_dir;
    if(SystemTools::FileIsDirectory(destination))
      {
      destination_dir = real_destination;
      SystemTools::ConvertToUnixSlashes(real_destination);
      real_destination += '/';
      std::string source_name = source;
      real_destination += SystemTools::GetFilenameName(source_name);
      }
    else
      {
      destination_dir = SystemTools::GetFilenamePath(destination);
      }

    // Create destination directory

    SystemTools::MakeDirectory(destination_dir);

    // Open files
#if defined(_WIN32)
    kwsys::ifstream fin(Encoding::ToNarrow(
      SystemTools::ConvertToWindowsExtendedPath(source)).c_str(),
                  std::ios::in | std::ios::binary);
#else
    kwsys::ifstream fin(source.c_str(),
                  std::ios::in | std::ios::binary);
#endif
    if(!fin)
      {
      return false;
      }

    // try and remove the destination file so that read only destination files
    // can be written to.
    // If the remove fails continue so that files in read only directories
    // that do not allow file removal can be modified.
    SystemTools::RemoveFile(real_destination);

#if defined(_WIN32)
    kwsys::ofstream fout(Encoding::ToNarrow(
      SystemTools::ConvertToWindowsExtendedPath(real_destination)).c_str(),
                     std::ios::out | std::ios::trunc | std::ios::binary);
#else
    kwsys::ofstream fout(real_destination.c_str(),
                     std::ios::out | std::ios::trunc | std::ios::binary);
#endif
    if(!fout)
      {
      return false;
      }

    // This copy loop is very sensitive on certain platforms with
    // slightly broken stream libraries (like HPUX).  Normally, it is
    // incorrect to not check the error condition on the fin.read()
    // before using the data, but the fin.gcount() will be zero if an
    // error occurred.  Therefore, the loop should be safe everywhere.
    while(fin)
      {
      fin.read(buffer, bufferSize);
      if(fin.gcount())
        {
        fout.write(buffer, fin.gcount());
        }
      else
        {
        break;
        }
      }

    // Make sure the operating system has finished writing the file
    // before closing it.  This will ensure the file is finished before
    // the check below.
    fout.flush();

    fin.close();
    fout.close();

    if(!fout)
      {
      return false;
      }
    }
  if ( perms )
    {
    if ( !SystemTools::SetPermissions(real_destination, perm) )
      {
      return false;
      }
    }
  return true;
}